

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O1

Adjacency_Graph<true> *
Disa::create_graph_structured<true>
          (Adjacency_Graph<true> *__return_storage_ptr__,size_t number_vertices)

{
  ulong uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  Edge local_48;
  unsigned_long local_38;
  
  (__return_storage_ptr__->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vertex_adjacent_list).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_adjacent_list).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_adjacent_list).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (number_vertices != 0) {
    uVar2 = 0;
    uVar1 = 0;
    sVar3 = number_vertices;
    local_38 = uVar2;
    do {
      do {
        if (sVar3 != 1) {
          local_48.second = uVar2 + 1;
          local_48.first = uVar2;
          Adjacency_Graph<true>::insert(__return_storage_ptr__,&local_48);
        }
        if (uVar1 < number_vertices - 1) {
          local_48.second = number_vertices + uVar2;
          local_48.first = uVar2;
          Adjacency_Graph<true>::insert(__return_storage_ptr__,&local_48);
        }
        uVar2 = uVar2 + 1;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
      uVar1 = uVar1 + 1;
      uVar2 = local_38 + number_vertices;
      sVar3 = number_vertices;
      local_38 = uVar2;
    } while (uVar1 != number_vertices);
  }
  return __return_storage_ptr__;
}

Assistant:

Adjacency_Graph<_directed> create_graph_structured(std::size_t number_vertices) {
  Adjacency_Graph<_directed> structured;
  for(std::size_t i_y = 0; i_y < number_vertices; ++i_y) {
    for(std::size_t i_x = 0; i_x < number_vertices; ++i_x) {
      const std::size_t i_vertex = i_y * (number_vertices) + i_x;
      if(!_directed && i_x != 0) structured.insert({i_vertex - 1, i_vertex});
      if(i_x != number_vertices - 1) structured.insert({i_vertex, i_vertex + 1});
      if(!_directed && i_y != 0) structured.insert({i_vertex - number_vertices, i_vertex});
      if(i_y < number_vertices - 1) structured.insert({i_vertex, i_vertex + number_vertices});
    }
  }
  return structured;
}